

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64AddressingModes.h
# Opt level: O0

uint64_t AArch64_AM_decodeAdvSIMDModImmType10(uint8_t Imm)

{
  uint8_t Imm_local;
  
  return CONCAT44(AArch64_AM_decodeAdvSIMDModImmType10::lookup[(int)(uint)Imm >> 4],
                  AArch64_AM_decodeAdvSIMDModImmType10::lookup[(int)(Imm & 0xf)]);
}

Assistant:

static inline uint64_t AArch64_AM_decodeAdvSIMDModImmType10(uint8_t Imm)
{
	static const uint32_t lookup[16] = {
		0x00000000, 0x000000ff, 0x0000ff00, 0x0000ffff, 
		0x00ff0000, 0x00ff00ff, 0x00ffff00, 0x00ffffff, 
		0xff000000, 0xff0000ff, 0xff00ff00, 0xff00ffff, 
		0xffff0000, 0xffff00ff, 0xffffff00, 0xffffffff
        };
	return lookup[Imm & 0x0f] | ((uint64_t)lookup[Imm >> 4] << 32);
}